

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O3

bool __thiscall runtime::VirtualMachine::booleanValueOfVariable(VirtualMachine *this,Variable var)

{
  byte bVar1;
  string local_40;
  
  bVar1 = 1;
  switch(var.type) {
  case Undefined:
    bVar1 = 0;
    break;
  case Integer:
  case Float:
  case String:
  case Object:
  case Function:
    break;
  case Boolean:
    bVar1 = var.field_1._0_1_;
    break;
  default:
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Unknown varible type at booleanValueOfVariable","");
    panic(this,&local_40);
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool runtime::VirtualMachine::booleanValueOfVariable(Variable var) {
  switch (var.type) {
    case VariableType::Integer:
    case VariableType::Float:
    case VariableType::Function:
    case VariableType::Object:
    case VariableType::String: {
      return true;
    }
    case VariableType::Undefined: {
      return false;
    }
    case VariableType::Boolean: {
      return var.boolValue;
    }
    default: {
      this->panic("Unknown varible type at booleanValueOfVariable");
    }
  }
}